

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

int loguru::init(EVP_PKEY_CTX *ctx)

{
  char cVar1;
  byte bVar2;
  Text *__s;
  Text TVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  ctype *pcVar7;
  undefined8 *in_RDX;
  uint uVar8;
  char *__s_00;
  long lVar9;
  EVP_PKEY_CTX *pEVar10;
  undefined8 *in_RSI;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  Text str_right;
  Text fail_info;
  Text user_msg;
  int local_f4;
  Text user_msg_2;
  Text str_left;
  sigset_t local_c0;
  byte local_40;
  
  pcVar6 = DAT_00145af0;
  if ((long)*(int *)ctx < 1) {
    textprintf((char *)&str_left,"%d");
    textprintf((char *)&str_right,"%d",0);
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",
               str_left._str,">",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x22b,"%s",user_msg._str);
  }
  if (in_RSI[*(int *)ctx] != 0) {
    textprintf((char *)&str_left,"N/A");
    textprintf((char *)&str_right,"N/A");
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==",
               "nullptr",str_left._str,"==",str_right._str);
    textprintf((char *)&user_msg,"Expected proper argc/argv");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x22c,"%s",user_msg._str);
  }
  pcVar5 = (char *)*in_RSI;
  pcVar14 = (char *)*in_RSI;
  do {
    do {
      __s_00 = pcVar5;
      pcVar5 = pcVar14 + 1;
      cVar1 = *pcVar14;
      pcVar14 = pcVar5;
    } while (cVar1 == '/');
  } while ((cVar1 == '\\') || (pcVar5 = __s_00, cVar1 != '\0'));
  strlen(__s_00);
  std::__cxx11::string::_M_replace(0x145ae8,0,pcVar6,(ulong)__s_00);
  pcVar6 = getcwd(&s_current_dir,0x1000);
  if (pcVar6 == (char *)0x0) {
    errno_as_text();
    iVar4 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar4 = g_stderr_verbosity;
    }
    if (-2 < iVar4) {
      log(__x);
    }
    free(str_left._str);
  }
  pcVar6 = (char *)0x0;
  __x_00 = (double)std::__cxx11::string::_M_replace(0x145b08,0,DAT_00145b10,0x13523d);
  uVar12 = (ulong)*(uint *)ctx;
  if (0 < (int)*(uint *)ctx) {
    lVar9 = 0;
    do {
      pcVar6 = (char *)in_RSI[lVar9];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str_left,pcVar6,(allocator<char> *)&str_right);
      uVar12 = local_c0.__val[0];
      TVar3 = str_left;
      __x_00 = extraout_XMM0_Qa;
      if (local_c0.__val[0] != 0) {
        uVar13 = 0;
        do {
          bVar2 = TVar3._str[uVar13];
          uVar8 = (uint)bVar2;
          if (0x1f < bVar2) {
            if (bVar2 < 0x27) {
              if (uVar8 == 0x20) {
                pcVar6 = "\\ ";
              }
              else {
                if (uVar8 != 0x22) goto switchD_0012af35_default;
                pcVar6 = "\\\"";
              }
            }
            else if (uVar8 == 0x27) {
              pcVar6 = "\\\'";
            }
            else {
              if (uVar8 != 0x5c) goto switchD_0012af35_default;
              pcVar6 = "\\\\";
            }
            goto switchD_0012af35_caseD_7;
          }
          pcVar6 = "\\a";
          switch(bVar2) {
          case 7:
            break;
          case 8:
            pcVar6 = "\\b";
            break;
          case 9:
            pcVar6 = "\\t";
            break;
          case 10:
            pcVar6 = "\\n";
            break;
          case 0xb:
            pcVar6 = "\\v";
            break;
          case 0xc:
            pcVar6 = "\\f";
            break;
          case 0xd:
            pcVar6 = "\\r";
            break;
          default:
switchD_0012af35_default:
            if (bVar2 < 0x20) {
              pcVar6 = "\\x";
              std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
              write_hex_digit((string *)(ulong)(bVar2 >> 4),(uint)pcVar6);
              write_hex_digit((string *)(ulong)(uVar8 & 0xf),(uint)pcVar6);
              __x_00 = extraout_XMM0_Qa_00;
            }
            else {
              pcVar6 = (char *)(ulong)(uint)(int)(char)bVar2;
              __x_00 = (double)std::__cxx11::string::push_back('\b');
            }
            goto LAB_0012afb0;
          }
switchD_0012af35_caseD_7:
          __x_00 = (double)std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
LAB_0012afb0:
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      if ((ulong *)str_left._str != local_c0.__val + 1) {
        pcVar6 = (char *)(local_c0.__val[1] + 1);
        operator_delete(str_left._str,(ulong)pcVar6);
        __x_00 = extraout_XMM0_Qa_01;
      }
      lVar9 = lVar9 + 1;
      if (lVar9 < *(int *)ctx) {
        pcVar6 = " ";
        __x_00 = (double)std::__cxx11::string::append((char *)&s_arguments_abi_cxx11_);
      }
      uVar12 = (ulong)*(int *)ctx;
    } while (lVar9 < (long)uVar12);
  }
  iVar4 = (int)uVar12;
  __s = (Text *)*in_RDX;
  if (__s != (Text *)0x0) {
    if (1 < iVar4) {
      local_f4 = 1;
      uVar8 = 1;
      do {
        pcVar14 = (char *)in_RSI[(int)uVar8];
        __n = strlen((char *)__s);
        pcVar6 = (char *)__s;
        iVar4 = strncmp(pcVar14,(char *)__s,__n);
        if (iVar4 == 0) {
          bVar2 = pcVar14[__n];
          pcVar6 = "";
          std::locale::locale((locale *)&str_right,"");
          pcVar7 = std::use_facet<std::ctype<char>>((locale *)&str_right);
          bVar15 = (*(byte *)(*(long *)(pcVar7 + 0x30) + 1 + (ulong)bVar2 * 2) & 4) == 0;
          __x_00 = (double)std::locale::~locale((locale *)&str_right);
        }
        else {
          bVar15 = false;
          __x_00 = extraout_XMM0_Qa_02;
        }
        if (bVar15) {
          if (pcVar14[__n] == '\0') {
            uVar8 = uVar8 + 1;
            pEVar10 = (EVP_PKEY_CTX *)(ulong)*(uint *)ctx;
            if ((int)*(uint *)ctx <= (int)uVar8) goto LAB_0012b490;
            pcVar14 = (char *)in_RSI[(int)uVar8];
            uVar11 = (int)uVar12 - 2;
          }
          else {
            uVar11 = (int)uVar12 - 1;
            pcVar14 = pcVar14 + __n;
          }
          uVar12 = (ulong)uVar11;
          pEVar10 = (EVP_PKEY_CTX *)(pcVar14 + (*pcVar14 == '='));
          iVar4 = get_verbosity_from_name((char *)pEVar10);
          __x_00 = extraout_XMM0_Qa_03;
          if (iVar4 == -10) {
            str_left._str = (char *)0x0;
            pcVar6 = (char *)&str_left;
            lVar9 = strtol((char *)pEVar10,(char **)pcVar6,10);
            g_stderr_verbosity = (int)lVar9;
            if ((str_left._str == (char *)0x0) ||
               (__x_00 = extraout_XMM0_Qa_04, iVar4 = g_stderr_verbosity, *str_left._str != '\0')) {
              init(pEVar10);
LAB_0012b490:
              textprintf((char *)&str_left,"%d",(ulong)uVar8);
              textprintf((char *)&fail_info,"%d",(ulong)pEVar10 & 0xffffffff);
              textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<",
                         "argc",str_left._str,"<",fail_info._str);
              textprintf((char *)&user_msg_2,"Missing verbosiy level after %s",__s);
              log_and_abort(0,user_msg._str,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                            ,0x1c1,"%s",user_msg_2._str);
            }
          }
        }
        else {
          lVar9 = (long)local_f4;
          local_f4 = local_f4 + 1;
          in_RSI[lVar9] = in_RSI[(int)uVar8];
          iVar4 = g_stderr_verbosity;
        }
        g_stderr_verbosity = iVar4;
        iVar4 = (int)uVar12;
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < *(int *)ctx);
    }
    *(int *)ctx = iVar4;
    in_RSI[iVar4] = 0;
  }
  if ((char *)in_RDX[1] != (char *)0x0) {
    set_thread_name((char *)in_RDX[1]);
    __x_00 = extraout_XMM0_Qa_05;
  }
  if (-1 < g_stderr_verbosity) {
    if (g_preamble_header == '\x01') {
      print_preamble_header((char *)&str_left,(size_t)pcVar6);
      if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == '\x01')) {
        fprintf(_stderr,"%s%s%s\n","\x1b[0m","\x1b[2m",&str_left);
      }
      else {
        fprintf(_stderr,"%s\n",&str_left);
      }
    }
    fflush(_stderr);
    __x_00 = extraout_XMM0_Qa_06;
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    __x_00 = log(__x_00);
  }
  if (s_current_dir != '\0') {
    iVar4 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar4 = g_stderr_verbosity;
    }
    if (g_internal_verbosity <= iVar4) {
      __x_00 = log(__x_00);
    }
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    __x_00 = log(__x_00);
  }
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar4) {
    log(__x_00);
  }
  _s_signal_options = in_RDX[2];
  memset(&str_left,0,0x98);
  sigemptyset(&local_c0);
  local_40 = local_40 | 4;
  str_left._str = (char *)signal_handler;
  if (*(char *)((long)in_RDX + 0x11) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0x6;
    iVar4 = sigaction(6,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 != -1) goto LAB_0012b336;
    init(pEVar10);
LAB_0012b668:
    init(pEVar10);
LAB_0012b66d:
    init(pEVar10);
LAB_0012b672:
    init(pEVar10);
LAB_0012b677:
    init(pEVar10);
LAB_0012b67c:
    init(pEVar10);
LAB_0012b681:
    iVar4 = init(pEVar10);
    free(in_RSI);
    _Unwind_Resume(iVar4);
  }
LAB_0012b336:
  if (*(char *)((long)in_RDX + 0x12) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0x7;
    iVar4 = sigaction(7,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b668;
  }
  if (*(char *)((long)in_RDX + 0x13) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0x8;
    iVar4 = sigaction(8,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b66d;
  }
  if (*(char *)((long)in_RDX + 0x14) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0x4;
    iVar4 = sigaction(4,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b672;
  }
  if (*(char *)((long)in_RDX + 0x15) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0x2;
    iVar4 = sigaction(2,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b677;
  }
  if (*(char *)((long)in_RDX + 0x16) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0xb;
    iVar4 = sigaction(0xb,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b67c;
  }
  if (*(char *)((long)in_RDX + 0x17) == '\x01') {
    pEVar10 = (EVP_PKEY_CTX *)0xf;
    iVar4 = sigaction(0xf,(sigaction *)&str_left,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_0012b681;
  }
  iVar4 = atexit(on_atexit);
  return iVar4;
}

Assistant:

void init(int& argc, char* argv[], const Options& options)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir))) {
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: " LOGURU_FMT(s) "", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (options.verbosity_flag) {
			parse_args(argc, argv, options.verbosity_flag);
		}

		if (const auto main_thread_name = options.main_thread_name) {
			#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
				set_thread_name(main_thread_name);
			#elif LOGURU_PTHREADS
				char old_thread_name[16] = {0};
				auto this_thread = pthread_self();
				#if defined(__APPLE__) || defined(__linux__) || defined(__sun)
					pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
				#endif
				if (old_thread_name[0] == 0) {
					#ifdef __APPLE__
						pthread_setname_np(main_thread_name);
					#elif defined(__FreeBSD__) || defined(__OpenBSD__)
						pthread_set_name_np(this_thread, main_thread_name);
					#elif defined(__linux__) || defined(__sun)
						pthread_setname_np(this_thread, main_thread_name);
					#endif
				}
			#endif // LOGURU_PTHREADS
		}

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble_header) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: " LOGURU_FMT(s) "", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: " LOGURU_FMT(s) "", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: " LOGURU_FMT(d) "", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers(options.signals);

		atexit(on_atexit);
	}